

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_ffmpeg.c
# Opt level: O3

int ffmpeg_open_file(input_handle *ih,char *filename)

{
  AVStream **ppAVar1;
  AVCodecContext *pAVar2;
  int iVar3;
  ulong uVar4;
  AVCodec *pAVar5;
  size_t sVar6;
  char *__s;
  AVFrame *pAVar7;
  long lVar8;
  ulong uVar9;
  AVCodecID AVar10;
  
  g_mutex_lock(&ffmpeg_mutex);
  ih->format_context = (AVFormatContext *)0x0;
  iVar3 = avformat_open_input(ih,filename,0,0);
  if (iVar3 == 0) {
    iVar3 = avformat_find_stream_info(ih->format_context);
    if (iVar3 < 0) {
      ffmpeg_open_file_cold_6();
    }
    else {
      ih->audio_stream = -1;
      uVar4 = (ulong)ih->format_context->nb_streams;
      if (uVar4 != 0) {
        ppAVar1 = ih->format_context->streams;
        lVar8 = 0;
        uVar9 = 0;
        do {
          if (ppAVar1[uVar9]->codec->codec_type == AVMEDIA_TYPE_AUDIO) {
            ih->audio_stream = (int)uVar9;
            pAVar2 = *(AVCodecContext **)(*(long *)((long)ppAVar1 + (lVar8 >> 0x1d)) + 8);
            ih->codec_context = pAVar2;
            pAVar2->request_sample_fmt = AV_SAMPLE_FMT_FLT;
            AVar10 = pAVar2->codec_id;
            if ((AVar10 == AV_CODEC_ID_OPUS) &&
               (AVar10 = AV_CODEC_ID_OPUS, 0x11 < pAVar2->extradata_size)) {
              pAVar2->extradata[0x11] = '\0';
              ih->codec_context->extradata[0x10] = '\0';
              AVar10 = ih->codec_context->codec_id;
            }
            pAVar5 = (AVCodec *)avcodec_find_decoder(AVar10);
            ih->codec = pAVar5;
            if (pAVar5 == (AVCodec *)0x0) {
              ffmpeg_open_file_cold_4();
            }
            else {
              sVar6 = strlen(pAVar5->name);
              __s = (char *)g_malloc(sVar6 + 7);
              sprintf(__s,"%sfloat",ih->codec->name);
              pAVar5 = (AVCodec *)avcodec_find_decoder_by_name(__s);
              if (pAVar5 != (AVCodec *)0x0) {
                ih->codec = pAVar5;
              }
              g_free(__s);
              iVar3 = avcodec_open2(ih->codec_context,ih->codec,0);
              if (iVar3 < 0) {
                ffmpeg_open_file_cold_3();
              }
              else {
                pAVar7 = (AVFrame *)av_frame_alloc();
                ih->frame = pAVar7;
                if (pAVar7 != (AVFrame *)0x0) {
                  av_init_packet(&ih->packet);
                  (ih->packet).data = (uint8_t *)0x0;
                  (ih->orig_packet).size = 0;
                  g_mutex_unlock(&ffmpeg_mutex);
                  ih->flushing = 0;
                  ih->got_frame = 0;
                  ih->packet_left = 0;
                  return 0;
                }
                ffmpeg_open_file_cold_2();
              }
            }
            goto LAB_0010159e;
          }
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x100000000;
        } while (uVar4 != uVar9);
      }
      ffmpeg_open_file_cold_5();
    }
LAB_0010159e:
    g_mutex_unlock(&ffmpeg_mutex);
    g_mutex_lock(&ffmpeg_mutex);
    avformat_close_input(ih);
    g_mutex_unlock(&ffmpeg_mutex);
  }
  else {
    ffmpeg_open_file_cold_1();
  }
  return 1;
}

Assistant:

static int
ffmpeg_open_file(struct input_handle *ih, char const *filename)
{
	size_t j;

	g_mutex_lock(&ffmpeg_mutex);
	ih->format_context = NULL;

	if (avformat_open_input(&ih->format_context, filename, NULL, NULL) !=
	    0) {
		fprintf(stderr, "Could not open input file!\n");
		g_mutex_unlock(&ffmpeg_mutex);
		return 1;
	}
	if (avformat_find_stream_info(ih->format_context, 0) < 0) {
		fprintf(stderr, "Could not find stream info!\n");
		g_mutex_unlock(&ffmpeg_mutex);
		goto close_file;
	}
	// av_dump_format(ih->format_context, 0, "blub", 0);

	// Find the first audio stream
	ih->audio_stream = -1;
	for (j = 0; j < ih->format_context->nb_streams; ++j) {
		if (ih->format_context->streams[j]->codec->codec_type ==
		    AVMEDIA_TYPE_AUDIO) {
			ih->audio_stream = (int)j;
			break;
		}
	}
	if (ih->audio_stream == -1) {
		fprintf(stderr, "Could not find an audio stream in file!\n");
		g_mutex_unlock(&ffmpeg_mutex);
		goto close_file;
	}
	// Get a pointer to the codec context for the audio stream
	ih->codec_context =
	    ih->format_context->streams[ih->audio_stream]->codec;

	ih->codec_context->request_sample_fmt = AV_SAMPLE_FMT_FLT;

	// Ignore Opus gain when decoding.
	if (ih->codec_context->codec_id == AV_CODEC_ID_OPUS &&
	    ih->codec_context->extradata_size >= 18) {
		ih->codec_context->extradata[16] =
		    ih->codec_context->extradata[17] = 0;
	}

	ih->codec = avcodec_find_decoder(ih->codec_context->codec_id);
	if (ih->codec == NULL) {
		fprintf(stderr,
		    "Could not find a decoder for the audio format!\n");
		g_mutex_unlock(&ffmpeg_mutex);
		goto close_file;
	}

	char *float_codec = g_malloc(
	    strlen(ih->codec->name) + sizeof("float") + 1);
	sprintf(float_codec, "%sfloat", ih->codec->name);
	AVCodec *possible_float_codec = avcodec_find_decoder_by_name(
	    float_codec);
	if (possible_float_codec) {
		ih->codec = possible_float_codec;
	}
	g_free(float_codec);

	// Open codec
	if (avcodec_open2(ih->codec_context, ih->codec, NULL) < 0) {
		fprintf(stderr, "Could not open the codec!\n");
		g_mutex_unlock(&ffmpeg_mutex);
		goto close_file;
	}

#if LIBAVCODEC_VERSION_INT >= AV_VERSION_INT(55, 28, 1)
	ih->frame = av_frame_alloc();
#else
	ih->frame = avcodec_alloc_frame();
#endif
	if (!ih->frame) {
		fprintf(stderr, "Could not allocate frame!\n");
		g_mutex_unlock(&ffmpeg_mutex);
		goto close_file;
	}

	av_init_packet(&ih->packet);
	ih->packet.data = NULL;
	ih->orig_packet.size = 0;

	g_mutex_unlock(&ffmpeg_mutex);

	ih->flushing = 0;
	ih->got_frame = 0;
	ih->packet_left = 0;

	return 0;

close_file:
	g_mutex_lock(&ffmpeg_mutex);
	avformat_close_input(&ih->format_context);
	g_mutex_unlock(&ffmpeg_mutex);
	return 1;
}